

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::ConvertDateMacroString(char *str,time_t *tmt)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  time_t tVar4;
  bool bVar5;
  char buffer [12];
  tm tmt2;
  char local_64 [3];
  undefined1 local_61;
  char local_60 [3];
  char local_5d [5];
  tm local_58;
  
  if ((tmt != (time_t *)0x0 && str != (char *)0x0) && (sVar2 = strlen(str), sVar2 < 0xc)) {
    strcpy(local_64,str);
    local_61 = 0;
    pcVar3 = strstr(ConvertDateMacroString::month_names,local_64);
    bVar5 = pcVar3 != (char *)0x0;
    if (!bVar5) {
      return bVar5;
    }
    iVar1 = atoi(local_60);
    local_58.tm_year = atoi(local_5d);
    local_58.tm_isdst = -1;
    local_58.tm_hour = 0;
    local_58.tm_sec = 0;
    local_58.tm_min = 0;
    local_58.tm_wday = 0;
    local_58.tm_yday = 0;
    local_58.tm_year = local_58.tm_year + -0x76c;
    local_58.tm_mday = iVar1;
    local_58.tm_mon = (int)((long)(pcVar3 + -0x674920) / 3);
    tVar4 = mktime(&local_58);
    *tmt = tVar4;
    return bVar5;
  }
  return false;
}

Assistant:

bool SystemTools::ConvertDateMacroString(const char* str, time_t* tmt)
{
  if (!str || !tmt || strlen(str) > 11) {
    return false;
  }

  struct tm tmt2;

  // __DATE__
  // The compilation date of the current source file. The date is a string
  // literal of the form Mmm dd yyyy. The month name Mmm is the same as for
  // dates generated by the library function asctime declared in TIME.H.

  // index:   012345678901
  // format:  Mmm dd yyyy
  // example: Dec 19 2003

  static char month_names[] = "JanFebMarAprMayJunJulAugSepOctNovDec";

  char buffer[12];
  strcpy(buffer, str);

  buffer[3] = 0;
  char* ptr = strstr(month_names, buffer);
  if (!ptr) {
    return false;
  }

  int month = static_cast<int>((ptr - month_names) / 3);
  int day = atoi(buffer + 4);
  int year = atoi(buffer + 7);

  tmt2.tm_isdst = -1;
  tmt2.tm_hour = 0;
  tmt2.tm_min = 0;
  tmt2.tm_sec = 0;
  tmt2.tm_wday = 0;
  tmt2.tm_yday = 0;
  tmt2.tm_mday = day;
  tmt2.tm_mon = month;
  tmt2.tm_year = year - 1900;

  *tmt = mktime(&tmt2);
  return true;
}